

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O0

void __thiscall
brotli::BlockSplitter<brotli::Histogram<704>_>::FinishBlock
          (BlockSplitter<brotli::Histogram<704>_> *this,bool is_final)

{
  value_type vVar1;
  size_t sVar2;
  size_type __n;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  Histogram<704> *local_1690;
  size_t last_histogram_ix;
  size_t j;
  double diff [2];
  double combined_entropy [2];
  Histogram<704> combined_histo [2];
  double entropy;
  bool is_final_local;
  BlockSplitter<brotli::Histogram<704>_> *this_local;
  
  if (this->block_size_ < this->min_block_size_) {
    this->block_size_ = this->min_block_size_;
  }
  if (this->num_blocks_ == 0) {
    sVar2 = this->block_size_;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->split_->lengths,0);
    *pvVar3 = (value_type)sVar2;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->split_->types,0);
    *pvVar4 = '\0';
    pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
             operator[](this->histograms_,0);
    dVar7 = BitsEntropy(pvVar5->data_,this->alphabet_size_);
    this->last_entropy_[0] = dVar7;
    this->last_entropy_[1] = this->last_entropy_[0];
    this->num_blocks_ = this->num_blocks_ + 1;
    this->split_->num_types = this->split_->num_types + 1;
    this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
    this->block_size_ = 0;
  }
  else if (this->block_size_ != 0) {
    pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
             operator[](this->histograms_,this->curr_histogram_ix_);
    dVar7 = BitsEntropy(pvVar5->data_,this->alphabet_size_);
    local_1690 = (Histogram<704> *)(combined_entropy + 1);
    do {
      Histogram<704>::Histogram(local_1690);
      local_1690 = local_1690 + 1;
    } while (local_1690 != (Histogram<704> *)&combined_histo[1].bit_cost_);
    for (last_histogram_ix = 0; last_histogram_ix < 2; last_histogram_ix = last_histogram_ix + 1) {
      __n = this->last_histogram_ix_[last_histogram_ix];
      pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
               operator[](this->histograms_,this->curr_histogram_ix_);
      memcpy(&combined_histo[last_histogram_ix - 1].bit_cost_,pvVar5,0xb10);
      pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
               operator[](this->histograms_,__n);
      Histogram<704>::AddHistogram
                ((Histogram<704> *)&combined_histo[last_histogram_ix - 1].bit_cost_,pvVar5);
      dVar8 = BitsEntropy((uint32_t *)&combined_histo[last_histogram_ix - 1].bit_cost_,
                          this->alphabet_size_);
      diff[last_histogram_ix + 1] = dVar8;
      diff[last_histogram_ix - 1] =
           (diff[last_histogram_ix + 1] - dVar7) - this->last_entropy_[last_histogram_ix];
    }
    if (((0xff < this->split_->num_types) ||
        ((double)j < this->split_threshold_ || (double)j == this->split_threshold_)) ||
       (diff[0] < this->split_threshold_ || diff[0] == this->split_threshold_)) {
      if ((double)j - 20.0 <= diff[0]) {
        sVar2 = this->block_size_;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->split_->lengths,this->num_blocks_ - 1);
        *pvVar3 = (int)sVar2 + *pvVar3;
        pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
                 operator[](this->histograms_,this->last_histogram_ix_[0]);
        memcpy(pvVar5,combined_entropy + 1,0xb10);
        this->last_entropy_[0] = diff[1];
        if (this->split_->num_types == 1) {
          this->last_entropy_[1] = this->last_entropy_[0];
        }
        this->block_size_ = 0;
        pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
                 operator[](this->histograms_,this->curr_histogram_ix_);
        Histogram<704>::Clear(pvVar5);
        uVar6 = this->merge_last_count_ + 1;
        this->merge_last_count_ = uVar6;
        if (1 < uVar6) {
          this->target_block_size_ = this->min_block_size_ + this->target_block_size_;
        }
      }
      else {
        sVar2 = this->block_size_;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->split_->lengths,this->num_blocks_);
        *pvVar3 = (value_type)sVar2;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->split_->types,this->num_blocks_ - 2);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->split_->types,this->num_blocks_);
        *pvVar4 = vVar1;
        std::swap<unsigned_long>(this->last_histogram_ix_,this->last_histogram_ix_ + 1);
        pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
                 operator[](this->histograms_,this->last_histogram_ix_[0]);
        memcpy(pvVar5,&combined_histo[0].bit_cost_,0xb10);
        this->last_entropy_[1] = this->last_entropy_[0];
        this->last_entropy_[0] = combined_entropy[0];
        this->num_blocks_ = this->num_blocks_ + 1;
        this->block_size_ = 0;
        pvVar5 = std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::
                 operator[](this->histograms_,this->curr_histogram_ix_);
        Histogram<704>::Clear(pvVar5);
        this->merge_last_count_ = 0;
        this->target_block_size_ = this->min_block_size_;
      }
    }
    else {
      sVar2 = this->block_size_;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->split_->lengths,this->num_blocks_);
      *pvVar3 = (value_type)sVar2;
      sVar2 = this->split_->num_types;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->split_->types,this->num_blocks_);
      *pvVar4 = (value_type)sVar2;
      this->last_histogram_ix_[1] = this->last_histogram_ix_[0];
      this->last_histogram_ix_[0] = this->split_->num_types & 0xff;
      this->last_entropy_[1] = this->last_entropy_[0];
      this->last_entropy_[0] = dVar7;
      this->num_blocks_ = this->num_blocks_ + 1;
      this->split_->num_types = this->split_->num_types + 1;
      this->curr_histogram_ix_ = this->curr_histogram_ix_ + 1;
      this->block_size_ = 0;
      this->merge_last_count_ = 0;
      this->target_block_size_ = this->min_block_size_;
    }
  }
  if (is_final) {
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
              (this->histograms_,this->split_->num_types);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->split_->types,this->num_blocks_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->split_->lengths,this->num_blocks_);
  }
  return;
}

Assistant:

void FinishBlock(bool is_final) {
    if (block_size_ < min_block_size_) {
      block_size_ = min_block_size_;
    }
    if (num_blocks_ == 0) {
      // Create first block.
      split_->lengths[0] = static_cast<uint32_t>(block_size_);
      split_->types[0] = 0;
      last_entropy_[0] =
          BitsEntropy(&(*histograms_)[0].data_[0], alphabet_size_);
      last_entropy_[1] = last_entropy_[0];
      ++num_blocks_;
      ++split_->num_types;
      ++curr_histogram_ix_;
      block_size_ = 0;
    } else if (block_size_ > 0) {
      double entropy = BitsEntropy(&(*histograms_)[curr_histogram_ix_].data_[0],
                                   alphabet_size_);
      HistogramType combined_histo[2];
      double combined_entropy[2];
      double diff[2];
      for (size_t j = 0; j < 2; ++j) {
        size_t last_histogram_ix = last_histogram_ix_[j];
        combined_histo[j] = (*histograms_)[curr_histogram_ix_];
        combined_histo[j].AddHistogram((*histograms_)[last_histogram_ix]);
        combined_entropy[j] = BitsEntropy(
            &combined_histo[j].data_[0], alphabet_size_);
        diff[j] = combined_entropy[j] - entropy - last_entropy_[j];
      }

      if (split_->num_types < kMaxBlockTypes &&
          diff[0] > split_threshold_ &&
          diff[1] > split_threshold_) {
        // Create new block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = static_cast<uint8_t>(split_->num_types);
        last_histogram_ix_[1] = last_histogram_ix_[0];
        last_histogram_ix_[0] = static_cast<uint8_t>(split_->num_types);
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = entropy;
        ++num_blocks_;
        ++split_->num_types;
        ++curr_histogram_ix_;
        block_size_ = 0;
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else if (diff[1] < diff[0] - 20.0) {
        // Combine this block with second last block.
        split_->lengths[num_blocks_] = static_cast<uint32_t>(block_size_);
        split_->types[num_blocks_] = split_->types[num_blocks_ - 2];
        std::swap(last_histogram_ix_[0], last_histogram_ix_[1]);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[1];
        last_entropy_[1] = last_entropy_[0];
        last_entropy_[0] = combined_entropy[1];
        ++num_blocks_;
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        merge_last_count_ = 0;
        target_block_size_ = min_block_size_;
      } else {
        // Combine this block with last block.
        split_->lengths[num_blocks_ - 1] += static_cast<uint32_t>(block_size_);
        (*histograms_)[last_histogram_ix_[0]] = combined_histo[0];
        last_entropy_[0] = combined_entropy[0];
        if (split_->num_types == 1) {
          last_entropy_[1] = last_entropy_[0];
        }
        block_size_ = 0;
        (*histograms_)[curr_histogram_ix_].Clear();
        if (++merge_last_count_ > 1) {
          target_block_size_ += min_block_size_;
        }
      }
    }
    if (is_final) {
      (*histograms_).resize(split_->num_types);
      split_->types.resize(num_blocks_);
      split_->lengths.resize(num_blocks_);
    }
  }